

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_traceexitstub(lua_State *L)

{
  uint uVar1;
  
  uVar1 = lj_lib_checkint(L,1);
  if (uVar1 < 0x200) {
    L->top[-1].n = (double)(long)((ulong)((uVar1 & 0x1f) << 2) +
                                 *(long *)((ulong)(L->glref).ptr32 + 0x8c8 + (ulong)(uVar1 >> 5) * 8
                                          ));
  }
  return (uint)(uVar1 < 0x200);
}

Assistant:

LJLIB_CF(jit_util_traceexitstub)
{
#ifdef EXITSTUBS_PER_GROUP
  ExitNo exitno = (ExitNo)lj_lib_checkint(L, 1);
  jit_State *J = L2J(L);
  if (exitno < EXITSTUBS_PER_GROUP*LJ_MAX_EXITSTUBGR) {
    setintptrV(L->top-1, (intptr_t)(void *)exitstub_addr(J, exitno));
    return 1;
  }
#else
  if (L->top > L->base+1) {  /* Don't throw for one-argument variant. */
    GCtrace *T = jit_checktrace(L);
    ExitNo exitno = (ExitNo)lj_lib_checkint(L, 2);
    ExitNo maxexit = T->root ? T->nsnap+1 : T->nsnap;
    if (T && T->mcode != NULL && exitno < maxexit) {
      setintptrV(L->top-1, (intptr_t)(void *)exitstub_trace_addr(T, exitno));
      return 1;
    }
  }
#endif
  return 0;
}